

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_ANonVar<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ArgSlot_OneByte outRegisterID;
  Var aValue;
  OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  outRegisterID = playout->Arg;
  aValue = GetNonVarReg(this,(uint)playout->Reg);
  SetOut(this,outRegisterID,aValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_ANonVar(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetNonVarReg(playout->Reg));
    }